

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Vec_Int_t * Gia_ManCollectReach(Gia_Man_t *p,int fOdd)

{
  int iObj;
  Vec_Int_t *vNodes;
  Gia_Obj_t *pObj;
  uint v;
  
  vNodes = Vec_IntAlloc(p->nObjs);
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  for (v = 0; (int)v < p->vCos->nSize; v = v + 1) {
    pObj = Gia_ManCo(p,v);
    iObj = Gia_ObjFaninId0p(p,pObj);
    if ((v & 1) == fOdd) {
      Gia_ManCollectDfs_rec(p,iObj,vNodes);
    }
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_ManCollectReach( Gia_Man_t * p, int fOdd )
{
    int i, iDriver;
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachCoDriverId( p, iDriver, i )
        if ( (i & 1) == fOdd )
            Gia_ManCollectDfs_rec( p, iDriver, vNodes );
    return vNodes;
}